

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_OneArgument_Test::~OptionParser_OneArgument_Test(OptionParser_OneArgument_Test *this)

{
  OptionParser_OneArgument_Test *this_local;
  
  ~OptionParser_OneArgument_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OptionParser, OneArgument) {
  std::string argument;
  OptionParser parser("prog", "desc");
  parser.AddArgument("arg", OptionParser::ArgumentCount::One,
                     [&](const char* arg) { argument = arg; });
  const char* args[] = {"prog name", "hello"};
  parser.Parse(2, const_cast<char**>(args));
  EXPECT_EQ("hello", argument);
}